

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

void __thiscall btMatrixX<float>::setIdentity(btMatrixX<float> *this)

{
  int iVar1;
  btMatrixX<float> *in_RDI;
  int row;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar2;
  int iVar3;
  
  setZero((btMatrixX<float> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  iVar2 = 0;
  while( true ) {
    iVar3 = iVar2;
    iVar1 = rows(in_RDI);
    if (iVar1 <= iVar2) break;
    setElem((btMatrixX<float> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
            in_stack_ffffffffffffffd8,0.0);
    iVar2 = iVar3 + 1;
  }
  return;
}

Assistant:

void setIdentity()
	{
		btAssert(rows() == cols());
		
		setZero();
		for (int row=0;row<rows();row++)
		{
			setElem(row,row,1);
		}
	}